

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_edit.h
# Opt level: O1

void __thiscall leveldb::VersionEdit::SetComparatorName(VersionEdit *this,Slice *name)

{
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  this->has_comparator_ = true;
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_38,name->data_,name->data_ + name->size_);
  std::__cxx11::string::operator=((string *)this,(string *)local_38);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0]);
  }
  return;
}

Assistant:

void SetComparatorName(const Slice& name) {
    has_comparator_ = true;
    comparator_ = name.ToString();
  }